

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_ptest(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  uintptr_t o;
  TCGv_i32 *ppTVar2;
  TCGTemp *local_38;
  TCGv_i32 local_30;
  TCGTemp *local_28;
  
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,insn >> 5 & 1);
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar2 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  local_30 = ppTVar2[insn & 7] + (long)tcg_ctx;
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_28 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_m68k(tcg_ctx,helper_ptest_m68k,(TCGTemp *)0x0,3,&local_38);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(ptest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv is_read;

    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }
    is_read = tcg_const_i32(tcg_ctx, (insn >> 5) & 1);
    gen_helper_ptest(tcg_ctx, tcg_ctx->cpu_env, AREG(insn, 0), is_read);
    tcg_temp_free(tcg_ctx, is_read);
}